

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_decode(uchar **out,uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  byte *data;
  LodePNGInfo *info;
  LodePNGColorMode *color;
  LodePNGColorMode *dest;
  LodePNGColorType colortype;
  uint uVar1;
  uint uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  bool bVar7;
  uchar uVar8;
  uint bpp;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uchar *puVar15;
  byte *chunk;
  uchar *puVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  size_t sVar20;
  uchar *puVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  byte bVar26;
  ulong uVar27;
  size_t __size;
  size_t bytewidth;
  ulong local_288;
  uchar *scanlines;
  size_t scanlines_size;
  size_t *local_240;
  uint passh_1 [7];
  uint passw_1 [7];
  uint passh [7];
  uint passw [7];
  size_t local_1b8 [8];
  size_t local_178 [8];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  
  scanlines = (uchar *)0x0;
  scanlines_size = 0;
  *out = (uchar *)0x0;
  *h = 0;
  *w = 0;
  uVar9 = lodepng_inspect(w,h,state,in,insize);
  state->error = uVar9;
  if (uVar9 != 0) {
    return uVar9;
  }
  uVar9 = *w;
  uVar19 = *h;
  uVar12 = 0x5c;
  if (CONCAT44(0,uVar19) * (ulong)uVar9 >> 0x3d != 0) {
LAB_0011cfc0:
    state->error = uVar12;
    return uVar12;
  }
  colortype = (state->info_raw).colortype;
  uVar12 = (state->info_raw).bitdepth;
  uVar11 = (state->info_png).color.bitdepth;
  uVar10 = getNumColorChannels((state->info_png).color.colortype);
  uVar10 = uVar10 * uVar11;
  uVar11 = getNumColorChannels(colortype);
  uVar11 = uVar11 * uVar12;
  if (uVar11 < uVar10) {
    uVar11 = uVar10;
  }
  uVar12 = 0x5c;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = ((ulong)(uVar9 & 7) * (ulong)uVar11 + 7 >> 3) + (ulong)(uVar9 >> 3) * (ulong)uVar11
                 + 5;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = CONCAT44(0,uVar19);
  if (SUB168(auVar4 * auVar5,8) != 0) goto LAB_0011cfc0;
  puVar15 = (uchar *)malloc(insize);
  if (puVar15 == (uchar *)0x0) {
    uVar12 = 0x53;
    goto LAB_0011cfc0;
  }
  info = &state->info_png;
  color = &(state->info_png).color;
  dest = &state->info_raw;
  chunk = in + 0x21;
  local_240 = (state->info_png).unknown_chunks_size;
  iVar13 = 1;
  uVar24 = 0;
  do {
    if ((chunk < in) || (uVar17 = ((long)chunk - (long)in) + 0xc, insize < uVar17)) {
      if ((state->decoder).ignore_end == 0) {
        uVar9 = 0x1e;
        goto LAB_0011d4ca;
      }
      break;
    }
    if ((int)((uint)*chunk << 0x18) < 0) {
      if ((state->decoder).ignore_end == 0) {
        uVar9 = 0x3f;
        goto LAB_0011d4ca;
      }
      break;
    }
    uVar19 = (uint)chunk[3] | (uint)chunk[1] << 0x10 | (uint)chunk[2] << 8 | (uint)*chunk << 0x18;
    uVar27 = (ulong)uVar19;
    uVar17 = uVar17 + uVar27;
    uVar9 = 0x40;
    if ((insize < uVar17) || (uVar17 < (ulong)((long)chunk - (long)in))) goto LAB_0011d4ca;
    data = chunk + 8;
    uVar8 = lodepng_chunk_type_equals(chunk,"IDAT");
    if (uVar8 == '\0') {
      uVar8 = lodepng_chunk_type_equals(chunk,"IEND");
      if (uVar8 != '\0') {
        bVar7 = true;
        bVar6 = false;
        goto LAB_0011cd03;
      }
      uVar8 = lodepng_chunk_type_equals(chunk,"PLTE");
      if (uVar8 != '\0') {
        uVar9 = readChunk_PLTE(color,data,uVar27);
        state->error = uVar9;
        if (uVar9 == 0) {
          iVar13 = 2;
          goto LAB_0011ccfe;
        }
        goto LAB_0011d4d1;
      }
      uVar8 = lodepng_chunk_type_equals(chunk,"tRNS");
      if (uVar8 != '\0') {
        uVar9 = readChunk_tRNS(color,data,uVar27);
LAB_0011cced:
        state->error = uVar9;
        if (uVar9 == 0) {
LAB_0011ccfe:
          bVar6 = true;
          bVar7 = false;
          goto LAB_0011cd03;
        }
        goto LAB_0011d4d1;
      }
      uVar8 = lodepng_chunk_type_equals(chunk,"bKGD");
      if (uVar8 != '\0') {
        uVar9 = readChunk_bKGD(info,data,uVar27);
        goto LAB_0011cced;
      }
      uVar8 = lodepng_chunk_type_equals(chunk,"tEXt");
      if (uVar8 != '\0') {
        if ((state->decoder).read_text_chunks == 0) goto LAB_0011ccfe;
        uVar9 = readChunk_tEXt(info,data,uVar27);
LAB_0011cddf:
        state->error = uVar9;
        if (uVar9 == 0) {
          bVar7 = false;
          bVar6 = true;
          goto LAB_0011cd03;
        }
        goto LAB_0011d4d1;
      }
      uVar8 = lodepng_chunk_type_equals(chunk,"zTXt");
      if (uVar8 != '\0') {
        if ((state->decoder).read_text_chunks != 0) {
          uVar9 = readChunk_zTXt(info,&state->decoder,data,uVar27);
          goto LAB_0011cddf;
        }
        goto LAB_0011ccfe;
      }
      uVar8 = lodepng_chunk_type_equals(chunk,"iTXt");
      if (uVar8 != '\0') {
        if ((state->decoder).read_text_chunks != 0) {
          uVar9 = readChunk_iTXt(info,&state->decoder,data,uVar27);
          goto LAB_0011cddf;
        }
        goto LAB_0011ccfe;
      }
      uVar8 = lodepng_chunk_type_equals(chunk,"tIME");
      if (uVar8 != '\0') {
        uVar9 = readChunk_tIME(info,data,uVar27);
        goto LAB_0011cced;
      }
      uVar8 = lodepng_chunk_type_equals(chunk,"pHYs");
      if (uVar8 != '\0') {
        uVar9 = readChunk_pHYs(info,data,uVar27);
        goto LAB_0011cced;
      }
      uVar8 = lodepng_chunk_type_equals(chunk,"gAMA");
      if (uVar8 != '\0') {
        if (uVar19 == 4) {
          (state->info_png).gama_defined = 1;
          uVar9 = *(uint *)(chunk + 8);
          (state->info_png).gama_gamma =
               uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
LAB_0011ce88:
          state->error = 0;
          goto LAB_0011ccfe;
        }
        uVar9 = 0x60;
        goto LAB_0011d4ca;
      }
      uVar8 = lodepng_chunk_type_equals(chunk,"cHRM");
      if (uVar8 != '\0') {
        uVar9 = readChunk_cHRM(info,data,uVar27);
        goto LAB_0011cced;
      }
      uVar8 = lodepng_chunk_type_equals(chunk,"sRGB");
      if (uVar8 != '\0') {
        if (uVar19 == 1) {
          (state->info_png).srgb_defined = 1;
          (state->info_png).srgb_intent = (uint)*data;
          goto LAB_0011ce88;
        }
        uVar9 = 0x62;
        goto LAB_0011d4ca;
      }
      uVar8 = lodepng_chunk_type_equals(chunk,"iCCP");
      if (uVar8 != '\0') {
        uVar9 = readChunk_iCCP(info,&state->decoder,data,uVar27);
        goto LAB_0011cced;
      }
      uVar8 = lodepng_chunk_type_equals(chunk,"sBIT");
      if (uVar8 != '\0') {
        uVar9 = readChunk_sBIT(info,data,uVar27);
        goto LAB_0011cced;
      }
      if (((state->decoder).ignore_critical == 0) && ((chunk[4] & 0x20) == 0)) {
        uVar9 = 0x45;
        goto LAB_0011d4ca;
      }
      if ((state->decoder).remember_unknown_chunks == 0) {
        bVar7 = false;
      }
      else {
        uVar9 = lodepng_chunk_append
                          ((state->info_png).unknown_chunks_data + (iVar13 - 1U),
                           local_240 + (iVar13 - 1U),chunk);
        state->error = uVar9;
        if (uVar9 != 0) goto LAB_0011d4d1;
        bVar7 = false;
      }
LAB_0011cd24:
      chunk = lodepng_chunk_next_const(chunk,in + insize);
    }
    else {
      uVar9 = 0x5f;
      if ((CARRY8(uVar24,uVar27)) || (insize < uVar24 + uVar27)) goto LAB_0011d4ca;
      iVar13 = 3;
      if (uVar27 != 0) {
        memcpy(puVar15 + uVar24,data,uVar27);
      }
      bVar6 = true;
      bVar7 = false;
      uVar24 = uVar24 + uVar27;
LAB_0011cd03:
      if (((state->decoder).ignore_crc == 0) && (uVar9 = lodepng_chunk_check_crc(chunk), uVar9 != 0)
         ) {
        uVar9 = 0x39;
        goto LAB_0011d4ca;
      }
      if (bVar6) goto LAB_0011cd24;
    }
  } while (!bVar7);
  if ((color->colortype == LCT_PALETTE) && ((state->info_png).color.palette == (uchar *)0x0)) {
    uVar9 = 0x6a;
LAB_0011d4ca:
    state->error = uVar9;
LAB_0011d4d1:
    free(puVar15);
    goto LAB_0011d4e5;
  }
  uVar9 = (state->info_png).interlace_method;
  uVar19 = (state->info_png).color.bitdepth;
  uVar12 = getNumColorChannels(color->colortype);
  uVar12 = uVar12 * uVar19;
  uVar19 = *w;
  uVar17 = (ulong)uVar12;
  if (uVar9 == 0) {
    sVar20 = (uVar17 * (uVar19 >> 3) + (ulong)((uVar19 & 7) * uVar12 + 7 >> 3) + 1) * (ulong)*h;
  }
  else {
    uVar11 = *h;
    lVar25 = (uVar19 + 7 >> 6) * uVar17 + (ulong)((uVar19 + 7 >> 3 & 7) * uVar12 + 7 >> 3) + 1;
    uVar9 = uVar19 + 3;
    if (4 < uVar19) {
      lVar25 = lVar25 + (ulong)((uVar9 >> 3 & 7) * uVar12 + 7 >> 3) + (uVar9 >> 6) * uVar17 + 1;
    }
    lVar25 = (ulong)(uVar11 + 3 >> 3) *
             ((uVar9 >> 5) * uVar17 + (ulong)((uVar9 >> 2 & 7) * uVar12 + 7 >> 3) + 1) +
             lVar25 * (ulong)(uVar11 + 7 >> 3);
    uVar9 = uVar19 + 1;
    if (2 < uVar19) {
      lVar25 = lVar25 + (ulong)(uVar11 + 3 >> 2) *
                        ((ulong)((uVar9 >> 2 & 7) * uVar12 + 7 >> 3) + (uVar9 >> 5) * uVar17 + 1);
    }
    lVar25 = (ulong)(uVar11 + 1 >> 2) *
             ((uVar9 >> 4) * uVar17 + (ulong)((uVar9 >> 1 & 7) * uVar12 + 7 >> 3) + 1) + lVar25;
    if (1 < uVar19) {
      lVar25 = lVar25 + (ulong)(uVar11 + 1 >> 1) *
                        ((ulong)((uVar19 >> 1 & 7) * uVar12 + 7 >> 3) + (uVar19 >> 4) * uVar17 + 1);
    }
    sVar20 = ((uVar19 >> 3) * uVar17 + (ulong)((uVar19 & 7) * uVar12 + 7 >> 3) + 1) *
             (ulong)(uVar11 >> 1) + lVar25;
  }
  uVar9 = zlib_decompress(&scanlines,&scanlines_size,sVar20,puVar15,uVar24,
                          (LodePNGDecompressSettings *)state);
  state->error = uVar9;
  if ((uVar9 == 0) && (scanlines_size != sVar20)) {
    state->error = 0x5b;
    free(puVar15);
    goto LAB_0011d4e5;
  }
  free(puVar15);
  if (uVar9 != 0) goto LAB_0011d4e5;
  uVar9 = *w;
  uVar19 = *h;
  uVar12 = (state->info_png).color.bitdepth;
  uVar11 = getNumColorChannels((state->info_png).color.colortype);
  uVar11 = uVar11 * uVar12;
  uVar17 = (ulong)uVar11;
  uVar24 = (ulong)uVar19 * (ulong)uVar9;
  __size = (((uint)uVar24 & 7) * uVar17 + 7 >> 3) + (uVar24 >> 3) * uVar17;
  puVar15 = (uchar *)malloc(__size);
  *out = puVar15;
  if (puVar15 == (uchar *)0x0) {
    state->error = 0x53;
    goto LAB_0011d4e5;
  }
  if (__size != 0) {
    memset(puVar15,0,__size);
  }
  puVar16 = scanlines;
  if (uVar11 == 0) {
    uVar12 = 0x1f;
  }
  else {
    if ((state->info_png).interlace_method == 0) {
      if (uVar11 < 8) {
        uVar10 = uVar11 * uVar9;
        uVar22 = uVar10 + 7 & 0xfffffff8;
        if (uVar10 != uVar22) {
          uVar12 = unfilter(scanlines,scanlines,uVar9,uVar19,uVar11);
          if (uVar12 != 0) goto LAB_0011d7c5;
          removePaddingBits(puVar15,puVar16,(ulong)uVar10,(ulong)uVar22,uVar19);
          goto LAB_0011d7af;
        }
      }
      uVar12 = unfilter(puVar15,scanlines,uVar9,uVar19,uVar11);
      if (uVar12 != 0) goto LAB_0011d7c5;
    }
    else {
      Adam7_getpassvalues(passw,passh,filter_passstart,padded_passstart,local_178,uVar9,uVar19,
                          uVar11);
      lVar25 = 0;
      do {
        lVar3 = *(long *)((long)padded_passstart + lVar25 * 2);
        uVar10 = *(uint *)((long)passw + lVar25);
        uVar22 = *(uint *)((long)passh + lVar25);
        uVar12 = unfilter(puVar16 + lVar3,puVar16 + *(long *)((long)filter_passstart + lVar25 * 2),
                          uVar10,uVar22,uVar11);
        if (uVar12 != 0) goto LAB_0011d7c5;
        if (uVar11 < 8) {
          uVar10 = uVar10 * uVar11;
          removePaddingBits(puVar16 + *(long *)((long)local_178 + lVar25 * 2),puVar16 + lVar3,
                            (ulong)uVar10,(ulong)(uVar10 + 7 & 0xfffffff8),uVar22);
        }
        lVar25 = lVar25 + 4;
      } while (lVar25 != 0x1c);
      Adam7_getpassvalues(passw_1,passh_1,filter_passstart_1,padded_passstart_1,local_1b8,uVar9,
                          uVar19,uVar11);
      if (uVar11 < 8) {
        lVar25 = 0;
        do {
          uVar19 = passh_1[lVar25];
          if ((ulong)uVar19 != 0) {
            uVar12 = passw_1[lVar25];
            local_288 = 0;
            do {
              if ((ulong)uVar12 != 0) {
                sVar20 = local_1b8[lVar25];
                uVar10 = ADAM7_IY[lVar25];
                uVar22 = ADAM7_DY[lVar25];
                uVar1 = ADAM7_IX[lVar25];
                uVar2 = ADAM7_DX[lVar25];
                uVar24 = 0;
                do {
                  uVar18 = (uVar24 * uVar2 + (ulong)uVar1) * uVar17 +
                           (uVar22 * local_288 + (ulong)uVar10) * (ulong)(uVar9 * uVar11);
                  uVar23 = (ulong)(((int)local_288 * uVar12 + (int)uVar24) * uVar11) + sVar20 * 8;
                  uVar27 = uVar17;
                  do {
                    bVar26 = '\x01' << (~(byte)uVar18 & 7);
                    if ((puVar16[uVar23 >> 3] >> (~(byte)uVar23 & 7) & 1) == 0) {
                      puVar15[uVar18 >> 3] = puVar15[uVar18 >> 3] & ~bVar26;
                    }
                    else {
                      puVar15[uVar18 >> 3] = puVar15[uVar18 >> 3] | bVar26;
                    }
                    uVar18 = uVar18 + 1;
                    uVar23 = uVar23 + 1;
                    uVar14 = (int)uVar27 - 1;
                    uVar27 = (ulong)uVar14;
                  } while (uVar14 != 0);
                  uVar24 = uVar24 + 1;
                } while (uVar24 != uVar12);
              }
              local_288 = local_288 + 1;
            } while (local_288 != uVar19);
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 != 7);
      }
      else {
        uVar24 = (ulong)(uVar11 >> 3);
        lVar25 = 0;
        do {
          uVar19 = passh_1[lVar25];
          if ((ulong)uVar19 != 0) {
            uVar12 = passw_1[lVar25];
            uVar17 = 0;
            uVar27 = 0;
            do {
              iVar13 = (int)uVar17;
              if ((ulong)uVar12 != 0) {
                uVar11 = ADAM7_DX[lVar25];
                puVar21 = puVar15 + ((ADAM7_DY[lVar25] * uVar27 + (ulong)ADAM7_IY[lVar25]) *
                                     (ulong)uVar9 + (ulong)ADAM7_IX[lVar25]) * uVar24;
                sVar20 = local_1b8[lVar25];
                uVar18 = 0;
                do {
                  uVar23 = 0;
                  do {
                    puVar21[uVar23] = puVar16[uVar23 + uVar17 * uVar24 + sVar20];
                    uVar23 = uVar23 + 1;
                  } while (uVar24 != uVar23);
                  uVar18 = uVar18 + 1;
                  puVar21 = puVar21 + uVar11 * uVar24;
                  uVar17 = (ulong)((int)uVar17 + 1);
                } while (uVar18 != uVar12);
              }
              uVar27 = uVar27 + 1;
              uVar17 = (ulong)(iVar13 + uVar12);
            } while (uVar27 != uVar19);
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 != 7);
      }
    }
LAB_0011d7af:
    uVar12 = 0;
  }
LAB_0011d7c5:
  state->error = uVar12;
LAB_0011d4e5:
  free(scanlines);
  if (state->error != 0) {
    return state->error;
  }
  if ((state->decoder).color_convert == 0) {
    uVar9 = lodepng_color_mode_copy(dest,color);
    state->error = uVar9;
    return uVar9;
  }
  iVar13 = lodepng_color_mode_equal(dest,color);
  if (iVar13 != 0) {
    return 0;
  }
  puVar15 = *out;
  if (((dest->colortype | LCT_GREY_ALPHA) != LCT_RGBA) && ((state->info_raw).bitdepth != 8)) {
    return 0x38;
  }
  uVar9 = *w;
  uVar19 = *h;
  uVar12 = (state->info_raw).bitdepth;
  uVar11 = getNumColorChannels(dest->colortype);
  uVar17 = (ulong)(uVar12 * uVar11);
  uVar24 = (ulong)uVar19 * (ulong)uVar9;
  puVar16 = (uchar *)malloc((((uint)uVar24 & 7) * uVar17 + 7 >> 3) + (uVar24 >> 3) * uVar17);
  *out = puVar16;
  if (puVar16 == (uchar *)0x0) {
    uVar9 = 0x53;
  }
  else {
    uVar9 = lodepng_convert(puVar16,puVar15,dest,color,uVar9,uVar19);
  }
  state->error = uVar9;
  free(puVar15);
  return state->error;
}

Assistant:

unsigned lodepng_decode(unsigned char** out, unsigned* w, unsigned* h,
                        LodePNGState* state,
                        const unsigned char* in, size_t insize) {
  *out = 0;
  decodeGeneric(out, w, h, state, in, insize);
  if(state->error) return state->error;
  if(!state->decoder.color_convert || lodepng_color_mode_equal(&state->info_raw, &state->info_png.color)) {
    /*same color type, no copying or converting of data needed*/
    /*store the info_png color settings on the info_raw so that the info_raw still reflects what colortype
    the raw image has to the end user*/
    if(!state->decoder.color_convert) {
      state->error = lodepng_color_mode_copy(&state->info_raw, &state->info_png.color);
      if(state->error) return state->error;
    }
  } else { /*color conversion needed*/
    unsigned char* data = *out;
    size_t outsize;

    /*TODO: check if this works according to the statement in the documentation: "The converter can convert
    from grayscale input color type, to 8-bit grayscale or grayscale with alpha"*/
    if(!(state->info_raw.colortype == LCT_RGB || state->info_raw.colortype == LCT_RGBA)
       && !(state->info_raw.bitdepth == 8)) {
      return 56; /*unsupported color mode conversion*/
    }

    outsize = lodepng_get_raw_size(*w, *h, &state->info_raw);
    *out = (unsigned char*)lodepng_malloc(outsize);
    if(!(*out)) {
      state->error = 83; /*alloc fail*/
    }
    else state->error = lodepng_convert(*out, data, &state->info_raw,
                                        &state->info_png.color, *w, *h);
    lodepng_free(data);
  }
  return state->error;
}